

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_demo.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined1 local_f0 [8];
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi D;
  mbedtls_mpi H;
  mbedtls_mpi N;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi E;
  int exit_code;
  int ret;
  
  E.p._4_4_ = 1;
  mbedtls_mpi_init((mbedtls_mpi *)&P.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_init((mbedtls_mpi *)&N.p);
  mbedtls_mpi_init((mbedtls_mpi *)&H.p);
  mbedtls_mpi_init((mbedtls_mpi *)&D.p);
  mbedtls_mpi_init((mbedtls_mpi *)&X.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Y.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Z.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_f0);
  iVar1 = mbedtls_mpi_read_string((mbedtls_mpi *)&Q.p,10,"2789");
  if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_read_string((mbedtls_mpi *)&N.p,10,"3203"), iVar1 == 0)
       ) && (iVar1 = mbedtls_mpi_read_string((mbedtls_mpi *)&P.p,10,"257"), iVar1 == 0)) &&
     (iVar1 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&H.p,(mbedtls_mpi *)&Q.p,(mbedtls_mpi *)&N.p),
     iVar1 == 0)) {
    printf("\n  Public key:\n\n");
    iVar1 = mbedtls_mpi_write_file("  N = ",(mbedtls_mpi *)&H.p,10,(FILE *)0x0);
    if ((iVar1 == 0) &&
       (iVar1 = mbedtls_mpi_write_file("  E = ",(mbedtls_mpi *)&P.p,10,(FILE *)0x0), iVar1 == 0)) {
      printf("\n  Private key:\n\n");
      iVar1 = mbedtls_mpi_write_file("  P = ",(mbedtls_mpi *)&Q.p,10,(FILE *)0x0);
      if ((((iVar1 == 0) &&
           ((iVar1 = mbedtls_mpi_write_file("  Q = ",(mbedtls_mpi *)&N.p,10,(FILE *)0x0), iVar1 == 0
            && (iVar1 = mbedtls_mpi_sub_int((mbedtls_mpi *)&Q.p,(mbedtls_mpi *)&Q.p,1), iVar1 == 0))
           )) && (iVar1 = mbedtls_mpi_sub_int((mbedtls_mpi *)&N.p,(mbedtls_mpi *)&N.p,1), iVar1 == 0
                 )) &&
         ((iVar1 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&D.p,(mbedtls_mpi *)&Q.p,(mbedtls_mpi *)&N.p),
          iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_inv_mod((mbedtls_mpi *)&X.p,(mbedtls_mpi *)&P.p,(mbedtls_mpi *)&D.p),
          iVar1 == 0)))) {
        mbedtls_mpi_write_file("  D = E^-1 mod (P-1)*(Q-1) = ",(mbedtls_mpi *)&X.p,10,(FILE *)0x0);
        iVar1 = mbedtls_mpi_read_string((mbedtls_mpi *)&Y.p,10,"55555");
        if ((iVar1 == 0) &&
           ((iVar1 = mbedtls_mpi_exp_mod((mbedtls_mpi *)&Z.p,(mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&P.p
                                         ,(mbedtls_mpi *)&H.p,(mbedtls_mpi *)0x0), iVar1 == 0 &&
            (iVar1 = mbedtls_mpi_exp_mod((mbedtls_mpi *)local_f0,(mbedtls_mpi *)&Z.p,
                                         (mbedtls_mpi *)&X.p,(mbedtls_mpi *)&H.p,(mbedtls_mpi *)0x0)
            , iVar1 == 0)))) {
          printf("\n  RSA operation:\n\n");
          iVar1 = mbedtls_mpi_write_file("  X (plaintext)  = ",(mbedtls_mpi *)&Y.p,10,(FILE *)0x0);
          if ((iVar1 == 0) &&
             ((iVar1 = mbedtls_mpi_write_file
                                 ("  Y (ciphertext) = X^E mod N = ",(mbedtls_mpi *)&Z.p,10,
                                  (FILE *)0x0), iVar1 == 0 &&
              (iVar1 = mbedtls_mpi_write_file
                                 ("  Z (decrypted)  = Y^D mod N = ",(mbedtls_mpi *)local_f0,10,
                                  (FILE *)0x0), iVar1 == 0)))) {
            printf("\n");
            E.p._4_4_ = 0;
          }
        }
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&P.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_free((mbedtls_mpi *)&N.p);
  mbedtls_mpi_free((mbedtls_mpi *)&H.p);
  mbedtls_mpi_free((mbedtls_mpi *)&D.p);
  mbedtls_mpi_free((mbedtls_mpi *)&X.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Y.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Z.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_f0);
  if (E.p._4_4_ != 0) {
    printf("\nAn error occurred.\n");
  }
  return E.p._4_4_;
}

Assistant:

int main( void )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_mpi E, P, Q, N, H, D, X, Y, Z;

    mbedtls_mpi_init( &E ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q ); mbedtls_mpi_init( &N );
    mbedtls_mpi_init( &H ); mbedtls_mpi_init( &D ); mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y );
    mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &P, 10, "2789" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &Q, 10, "3203" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &E, 10,  "257" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &N, &P, &Q ) );

    mbedtls_printf( "\n  Public key:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  N = ", &N, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  E = ", &E, 10, NULL ) );

    mbedtls_printf( "\n  Private key:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  P = ", &P, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Q = ", &Q, 10, NULL ) );

#if defined(MBEDTLS_GENPRIME)
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P, &P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q, &Q, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P, &Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &D, &E, &H ) );

    mbedtls_mpi_write_file( "  D = E^-1 mod (P-1)*(Q-1) = ",
                    &D, 10, NULL );
#else
    mbedtls_printf("\nTest skipped (MBEDTLS_GENPRIME not defined).\n\n");
#endif
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &X, 10, "55555" ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &Y, &X, &E, &N, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &Z, &Y, &D, &N, NULL ) );

    mbedtls_printf( "\n  RSA operation:\n\n" );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  X (plaintext)  = ", &X, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Y (ciphertext) = X^E mod N = ", &Y, 10, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "  Z (decrypted)  = Y^D mod N = ", &Z, 10, NULL ) );
    mbedtls_printf( "\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:
    mbedtls_mpi_free( &E ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q ); mbedtls_mpi_free( &N );
    mbedtls_mpi_free( &H ); mbedtls_mpi_free( &D ); mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y );
    mbedtls_mpi_free( &Z );

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_printf( "\nAn error occurred.\n" );
    }

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}